

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_codestream_index_t * j2k_get_cstr_index(opj_j2k_v2_t *p_j2k)

{
  uint uVar1;
  opj_codestream_index_t *poVar2;
  opj_tile_index_t *poVar3;
  void *pvVar4;
  size_t sVar5;
  OPJ_OFF_T OVar6;
  opj_codestream_index_t *__ptr;
  opj_marker_info_t *__ptr_00;
  opj_tile_index_t *__ptr_01;
  void *pvVar7;
  ulong uVar8;
  ulong __nmemb;
  long lVar9;
  opj_marker_info_t **ppoVar10;
  
  __ptr = (opj_codestream_index_t *)calloc(1,0x38);
  if (__ptr != (opj_codestream_index_t *)0x0) {
    poVar2 = p_j2k->cstr_index;
    OVar6 = poVar2->main_head_end;
    __ptr->main_head_start = poVar2->main_head_start;
    __ptr->main_head_end = OVar6;
    __ptr->codestream_size = poVar2->codestream_size;
    uVar1 = poVar2->marknum;
    __ptr->marknum = uVar1;
    sVar5 = (ulong)uVar1 * 0x18;
    __ptr_00 = (opj_marker_info_t *)malloc(sVar5);
    __ptr->marker = __ptr_00;
    if (__ptr_00 != (opj_marker_info_t *)0x0) {
      if (poVar2->marker == (opj_marker_info_t *)0x0) {
        free(__ptr_00);
        __ptr->marker = (opj_marker_info_t *)0x0;
        __ptr_00 = (opj_marker_info_t *)0x0;
      }
      else {
        memcpy(__ptr_00,poVar2->marker,sVar5);
      }
      __nmemb = (ulong)poVar2->nb_of_tiles;
      __ptr->nb_of_tiles = poVar2->nb_of_tiles;
      __ptr_01 = (opj_tile_index_t *)calloc(__nmemb,0x38);
      __ptr->tile_index = __ptr_01;
      if (__ptr_01 != (opj_tile_index_t *)0x0) {
        if (poVar2->tile_index == (opj_tile_index_t *)0x0) {
          free(__ptr_01);
          __ptr->tile_index = (opj_tile_index_t *)0x0;
          return __ptr;
        }
        if (__nmemb == 0) {
          return __ptr;
        }
        poVar2 = p_j2k->cstr_index;
        lVar9 = 0x18;
        uVar8 = 0;
        while( true ) {
          poVar3 = poVar2->tile_index;
          uVar1 = *(uint *)((long)&poVar3->tileno + lVar9);
          *(uint *)((long)&__ptr_01->tileno + lVar9) = uVar1;
          sVar5 = (ulong)uVar1 * 0x18;
          pvVar7 = malloc(sVar5);
          *(void **)((long)&__ptr_01->current_nb_tps + lVar9) = pvVar7;
          if (pvVar7 == (void *)0x0) {
            if (uVar8 != 0) {
              ppoVar10 = &__ptr_01->marker;
              do {
                free(*ppoVar10);
                ppoVar10 = ppoVar10 + 7;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
            goto LAB_00129548;
          }
          pvVar4 = *(void **)((long)&poVar3->current_nb_tps + lVar9);
          if (pvVar4 == (void *)0x0) {
            free(pvVar7);
            *(undefined8 *)((long)&__ptr_01->current_nb_tps + lVar9) = 0;
          }
          else {
            memcpy(pvVar7,pvVar4,sVar5);
          }
          poVar3 = poVar2->tile_index;
          uVar1 = *(uint *)((long)poVar3 + lVar9 + -0x14);
          *(uint *)((long)__ptr_01 + lVar9 + -0x14) = uVar1;
          sVar5 = (ulong)uVar1 * 0x18;
          pvVar7 = malloc(sVar5);
          *(void **)((long)__ptr_01 + lVar9 + -8) = pvVar7;
          if (pvVar7 == (void *)0x0) break;
          pvVar4 = *(void **)((long)poVar3 + lVar9 + -8);
          if (pvVar4 == (void *)0x0) {
            free(pvVar7);
            *(undefined8 *)((long)__ptr_01 + lVar9 + -8) = 0;
          }
          else {
            memcpy(pvVar7,pvVar4,sVar5);
          }
          *(undefined4 *)((long)&__ptr_01->tp_index + lVar9 + 4) = 0;
          *(undefined8 *)((long)&__ptr_01->marknum + lVar9) = 0;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x38;
          if (__nmemb == uVar8) {
            return __ptr;
          }
        }
        if (uVar8 != 0) {
          ppoVar10 = &__ptr_01->marker;
          do {
            free(*ppoVar10);
            free((opj_tp_index_t *)ppoVar10[-2]);
            ppoVar10 = ppoVar10 + 7;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
LAB_00129548:
        free(__ptr_01);
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (opj_codestream_index_t *)0x0;
}

Assistant:

opj_codestream_index_t* j2k_get_cstr_index(opj_j2k_v2_t* p_j2k)
{
 	opj_codestream_index_t* l_cstr_index = (opj_codestream_index_t*)
			opj_calloc(1,sizeof(opj_codestream_index_t));
	if (!l_cstr_index)
		return NULL;

	l_cstr_index->main_head_start = p_j2k->cstr_index->main_head_start;
	l_cstr_index->main_head_end = p_j2k->cstr_index->main_head_end;
	l_cstr_index->codestream_size = p_j2k->cstr_index->codestream_size;

	l_cstr_index->marknum = p_j2k->cstr_index->marknum;
	l_cstr_index->marker = (opj_marker_info_t*)opj_malloc(l_cstr_index->marknum*sizeof(opj_marker_info_t));
	if (!l_cstr_index->marker){
		opj_free( l_cstr_index);
		return NULL;
	}

	if (p_j2k->cstr_index->marker)
		memcpy(l_cstr_index->marker, p_j2k->cstr_index->marker, l_cstr_index->marknum * sizeof(opj_marker_info_t) );
	else{
		opj_free(l_cstr_index->marker);
		l_cstr_index->marker = NULL;
	}

	l_cstr_index->nb_of_tiles = p_j2k->cstr_index->nb_of_tiles;
	l_cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(l_cstr_index->nb_of_tiles, sizeof(opj_tile_index_t) );
	if (!l_cstr_index->tile_index){
		opj_free( l_cstr_index->marker);
		opj_free( l_cstr_index);
		return NULL;
	}

	if (!p_j2k->cstr_index->tile_index){
		opj_free(l_cstr_index->tile_index);
		l_cstr_index->tile_index = NULL;
	}
	else {
		OPJ_UINT32 it_tile = 0;
		for (it_tile = 0; it_tile < l_cstr_index->nb_of_tiles; it_tile++ ){

			/* Tile Marker*/
			l_cstr_index->tile_index[it_tile].marknum = p_j2k->cstr_index->tile_index[it_tile].marknum;

			l_cstr_index->tile_index[it_tile].marker =
				(opj_marker_info_t*)opj_malloc(l_cstr_index->tile_index[it_tile].marknum*sizeof(opj_marker_info_t));

			if (!l_cstr_index->tile_index[it_tile].marker) {
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].marker)
				memcpy(	l_cstr_index->tile_index[it_tile].marker,
						p_j2k->cstr_index->tile_index[it_tile].marker,
						l_cstr_index->tile_index[it_tile].marknum * sizeof(opj_marker_info_t) );
			else{
				opj_free(l_cstr_index->tile_index[it_tile].marker);
				l_cstr_index->tile_index[it_tile].marker = NULL;
			}

			/* Tile part index*/
			l_cstr_index->tile_index[it_tile].nb_tps = p_j2k->cstr_index->tile_index[it_tile].nb_tps;

			l_cstr_index->tile_index[it_tile].tp_index =
				(opj_tp_index_t*)opj_malloc(l_cstr_index->tile_index[it_tile].nb_tps*sizeof(opj_tp_index_t));

			if(!l_cstr_index->tile_index[it_tile].tp_index){
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
					opj_free(l_cstr_index->tile_index[it_tile_free].tp_index);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].tp_index){
				memcpy(	l_cstr_index->tile_index[it_tile].tp_index,
						p_j2k->cstr_index->tile_index[it_tile].tp_index,
						l_cstr_index->tile_index[it_tile].nb_tps * sizeof(opj_tp_index_t) );
			}
			else{
				opj_free(l_cstr_index->tile_index[it_tile].tp_index);
				l_cstr_index->tile_index[it_tile].tp_index = NULL;
			}

			/* Packet index (NOT USED)*/
			l_cstr_index->tile_index[it_tile].nb_packet = 0;
			l_cstr_index->tile_index[it_tile].packet_index = NULL;

		}
	}

	return l_cstr_index;
}